

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool __thiscall cmSystemTools::EnvDiff::ParseOperation(EnvDiff *this,string *envmod)

{
  _Alloc_hider _Var1;
  long lVar2;
  optional<std::__cxx11::string> *this_00;
  mapped_type *pmVar3;
  long *plVar4;
  iterator __position;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> op;
  _Any_data local_f0;
  undefined1 local_e0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  pointer local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined8 local_30;
  
  lVar2 = std::__cxx11::string::find((char)envmod,0x3d);
  if (lVar2 == -1) {
    local_70._M_dataplus._M_p = (pointer)0x2f;
    local_70._M_string_length = 0x242c4b;
    local_70.field_2._M_allocated_capacity = 0;
    local_50 = (envmod->_M_dataplus)._M_p;
    local_70.field_2._8_8_ = envmod->_M_string_length;
    local_48 = 0;
    local_a8.field_2._M_allocated_capacity = (long)&local_a8.field_2 + 8;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 1;
    local_a8.field_2._M_local_buf[8] = '\n';
    local_40 = 1;
    local_30 = 0;
    views._M_len = 3;
    views._M_array = (iterator)&local_70;
    local_38 = (undefined1 *)local_a8.field_2._M_allocated_capacity;
    cmCatViews((string *)(local_e0 + 0x18),views);
    Error((string *)(local_e0 + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._24_8_ != &local_b8) {
      operator_delete((void *)local_e0._24_8_,local_b8._M_allocated_capacity + 1);
    }
    return false;
  }
  std::__cxx11::string::substr((ulong)(local_e0 + 0x18),(ulong)envmod);
  lVar2 = std::__cxx11::string::find((char)envmod,0x3a);
  if (lVar2 == -1) {
    local_70._M_dataplus._M_p = (pointer)0x2b;
    local_70._M_string_length = 0x242c7b;
    local_70.field_2._M_allocated_capacity = 0;
    local_50 = (envmod->_M_dataplus)._M_p;
    local_70.field_2._8_8_ = envmod->_M_string_length;
    local_48 = 0;
    local_a8.field_2._M_allocated_capacity = (long)&local_a8.field_2 + 8;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 1;
    local_a8.field_2._M_local_buf[8] = '\n';
    local_40 = 1;
    local_30 = 0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&local_70;
    local_38 = (undefined1 *)local_a8.field_2._M_allocated_capacity;
    cmCatViews((string *)&local_f0,views_00);
    Error((string *)&local_f0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_f0._M_unused._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0) {
      operator_delete(local_f0._M_unused._M_object,(ulong)(local_e0._0_8_ + 1));
    }
    bVar5 = false;
    goto LAB_00114f1d;
  }
  std::__cxx11::string::substr((ulong)&local_70,(ulong)envmod);
  std::__cxx11::string::substr((ulong)&local_a8,(ulong)envmod);
  switch(local_70._M_string_length) {
  case 3:
    if ((char)*(short *)(local_70._M_dataplus._M_p + 2) != 't' ||
        *(short *)local_70._M_dataplus._M_p != 0x6573) break;
    this_00 = (optional<std::__cxx11::string> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&this->diff,(key_type *)(local_e0 + 0x18));
    bVar5 = true;
    std::optional<std::__cxx11::string>::operator=(this_00,&local_a8);
    goto LAB_00114ee1;
  case 5:
    if ((char)*(int *)(local_70._M_dataplus._M_p + 4) == 't' &&
        *(int *)local_70._M_dataplus._M_p == 0x65736572) {
      __position = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)this,(key_type *)(local_e0 + 0x18));
      bVar5 = true;
      if (__position._M_node != (_Base_ptr)&this->field_0x8) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)this,(const_iterator)__position._M_node);
      }
    }
    else {
      if ((char)*(int *)(local_70._M_dataplus._M_p + 4) != 't' ||
          *(int *)local_70._M_dataplus._M_p != 0x65736e75) break;
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&this->diff,(key_type *)(local_e0 + 0x18));
      bVar5 = true;
      if ((pmVar3->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        (pmVar3->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
        _Var1._M_p = (pmVar3->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._M_value._M_dataplus._M_p;
        plVar4 = (long *)((long)&(pmVar3->
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_payload + 0x10);
        if ((long *)_Var1._M_p != plVar4) {
          operator_delete(_Var1._M_p,*plVar4 + 1);
        }
      }
    }
    goto LAB_00114ee1;
  case 0xd:
    if (*(long *)(local_70._M_dataplus._M_p + 5) == 0x646e657070615f67 &&
        *(long *)local_70._M_dataplus._M_p == 0x615f676e69727473) {
      local_f0._8_8_ = 0;
      local_e0._8_8_ =
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1727:22)>
           ::_M_invoke;
      local_e0._0_8_ =
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1727:22)>
           ::_M_manager;
      local_f0._M_unused._M_object = &local_a8;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,(string *)(local_e0 + 0x18),
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_f0);
      if ((code *)local_e0._0_8_ != (code *)0x0) {
        (*(code *)local_e0._0_8_)(&local_f0,&local_f0,3);
      }
      goto LAB_00114ede;
    }
    break;
  case 0xe:
    if (*(long *)(local_70._M_dataplus._M_p + 6) == 0x646e65706572705f &&
        *(long *)local_70._M_dataplus._M_p == 0x705f676e69727473) {
      local_f0._8_8_ = 0;
      local_e0._8_8_ =
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1730:16)>
           ::_M_invoke;
      local_e0._0_8_ =
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1730:16)>
           ::_M_manager;
      local_f0._M_unused._M_object = &local_a8;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,(string *)(local_e0 + 0x18),
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_f0);
      if ((code *)local_e0._0_8_ != (code *)0x0) {
        (*(code *)local_e0._0_8_)(&local_f0,&local_f0,3);
      }
      goto LAB_00114ede;
    }
    break;
  case 0x10:
    auVar9[0] = -(*local_70._M_dataplus._M_p == 'p');
    auVar9[1] = -(local_70._M_dataplus._M_p[1] == 'a');
    auVar9[2] = -((char)*(short *)(local_70._M_dataplus._M_p + 2) == 't');
    auVar9[3] = -(local_70._M_dataplus._M_p[3] == 'h');
    auVar9[4] = -((char)*(int *)(local_70._M_dataplus._M_p + 4) == '_');
    auVar9[5] = -(local_70._M_dataplus._M_p[5] == 'l');
    auVar9[6] = -((char)*(short *)(local_70._M_dataplus._M_p + 6) == 'i');
    auVar9[7] = -(local_70._M_dataplus._M_p[7] == 's');
    auVar9[8] = -((char)*(long *)(local_70._M_dataplus._M_p + 8) == 't');
    auVar9[9] = -(local_70._M_dataplus._M_p[9] == '_');
    auVar9[10] = -((char)*(short *)(local_70._M_dataplus._M_p + 10) == 'a');
    auVar9[0xb] = -(local_70._M_dataplus._M_p[0xb] == 'p');
    auVar9[0xc] = -((char)*(int *)(local_70._M_dataplus._M_p + 0xc) == 'p');
    auVar9[0xd] = -(local_70._M_dataplus._M_p[0xd] == 'e');
    auVar9[0xe] = -((char)*(short *)(local_70._M_dataplus._M_p + 0xe) == 'n');
    auVar9[0xf] = -(local_70._M_dataplus._M_p[0xf] == 'd');
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
        == 0xffff) {
      local_f0._8_8_ = 0x3a;
      local_e0._8_8_ =
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1732:22)>
           ::_M_invoke;
      local_e0._0_8_ =
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1732:22)>
           ::_M_manager;
      local_f0._M_unused._M_object = &local_a8;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,(string *)(local_e0 + 0x18),
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_f0);
      if ((code *)local_e0._0_8_ != (code *)0x0) {
        (*(code *)local_e0._0_8_)(&local_f0,&local_f0,3);
      }
      goto LAB_00114ede;
    }
    break;
  case 0x11:
    auVar6[0] = -(*local_70._M_dataplus._M_p == 'p');
    auVar6[1] = -(local_70._M_dataplus._M_p[1] == 'a');
    auVar6[2] = -((char)*(short *)(local_70._M_dataplus._M_p + 2) == 't');
    auVar6[3] = -(local_70._M_dataplus._M_p[3] == 'h');
    auVar6[4] = -((char)*(int *)(local_70._M_dataplus._M_p + 4) == '_');
    auVar6[5] = -(local_70._M_dataplus._M_p[5] == 'l');
    auVar6[6] = -((char)*(short *)(local_70._M_dataplus._M_p + 6) == 'i');
    auVar6[7] = -(local_70._M_dataplus._M_p[7] == 's');
    auVar6[8] = -((char)*(long *)(local_70._M_dataplus._M_p + 8) == 't');
    auVar6[9] = -(local_70._M_dataplus._M_p[9] == '_');
    auVar6[10] = -((char)*(short *)(local_70._M_dataplus._M_p + 10) == 'p');
    auVar6[0xb] = -(local_70._M_dataplus._M_p[0xb] == 'r');
    auVar6[0xc] = -((char)*(int *)(local_70._M_dataplus._M_p + 0xc) == 'e');
    auVar6[0xd] = -(local_70._M_dataplus._M_p[0xd] == 'p');
    auVar6[0xe] = -((char)*(short *)(local_70._M_dataplus._M_p + 0xe) == 'e');
    auVar6[0xf] = -(local_70._M_dataplus._M_p[0xf] == 'n');
    auVar10[0] = -((char)*(long *)(local_70._M_dataplus._M_p + 0x10) == 'd');
    auVar10[1] = 0xff;
    auVar10[2] = 0xff;
    auVar10[3] = 0xff;
    auVar10[4] = 0xff;
    auVar10[5] = 0xff;
    auVar10[6] = 0xff;
    auVar10[7] = 0xff;
    auVar10[8] = 0xff;
    auVar10[9] = 0xff;
    auVar10[10] = 0xff;
    auVar10[0xb] = 0xff;
    auVar10[0xc] = 0xff;
    auVar10[0xd] = 0xff;
    auVar10[0xe] = 0xff;
    auVar10[0xf] = 0xff;
    auVar10 = auVar10 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
      local_f0._8_8_ = 0x3a;
      local_e0._8_8_ =
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1739:22)>
           ::_M_invoke;
      local_e0._0_8_ =
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1739:22)>
           ::_M_manager;
      local_f0._M_unused._M_object = &local_a8;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,(string *)(local_e0 + 0x18),
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_f0);
      if ((code *)local_e0._0_8_ != (code *)0x0) {
        (*(code *)local_e0._0_8_)(&local_f0,&local_f0,3);
      }
    }
    else {
      auVar7[0] = -(*local_70._M_dataplus._M_p == 'c');
      auVar7[1] = -(local_70._M_dataplus._M_p[1] == 'm');
      auVar7[2] = -((char)*(short *)(local_70._M_dataplus._M_p + 2) == 'a');
      auVar7[3] = -(local_70._M_dataplus._M_p[3] == 'k');
      auVar7[4] = -((char)*(int *)(local_70._M_dataplus._M_p + 4) == 'e');
      auVar7[5] = -(local_70._M_dataplus._M_p[5] == '_');
      auVar7[6] = -((char)*(short *)(local_70._M_dataplus._M_p + 6) == 'l');
      auVar7[7] = -(local_70._M_dataplus._M_p[7] == 'i');
      auVar7[8] = -((char)*(long *)(local_70._M_dataplus._M_p + 8) == 's');
      auVar7[9] = -(local_70._M_dataplus._M_p[9] == 't');
      auVar7[10] = -((char)*(short *)(local_70._M_dataplus._M_p + 10) == '_');
      auVar7[0xb] = -(local_70._M_dataplus._M_p[0xb] == 'a');
      auVar7[0xc] = -((char)*(int *)(local_70._M_dataplus._M_p + 0xc) == 'p');
      auVar7[0xd] = -(local_70._M_dataplus._M_p[0xd] == 'p');
      auVar7[0xe] = -((char)*(short *)(local_70._M_dataplus._M_p + 0xe) == 'e');
      auVar7[0xf] = -(local_70._M_dataplus._M_p[0xf] == 'n');
      auVar11[0] = -((char)*(long *)(local_70._M_dataplus._M_p + 0x10) == 'd');
      auVar11[1] = 0xff;
      auVar11[2] = 0xff;
      auVar11[3] = 0xff;
      auVar11[4] = 0xff;
      auVar11[5] = 0xff;
      auVar11[6] = 0xff;
      auVar11[7] = 0xff;
      auVar11[8] = 0xff;
      auVar11[9] = 0xff;
      auVar11[10] = 0xff;
      auVar11[0xb] = 0xff;
      auVar11[0xc] = 0xff;
      auVar11[0xd] = 0xff;
      auVar11[0xe] = 0xff;
      auVar11[0xf] = 0xff;
      auVar11 = auVar11 & auVar7;
      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) break;
      local_f0._8_8_ = 0;
      local_e0._8_8_ =
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1746:22)>
           ::_M_invoke;
      local_e0._0_8_ =
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1746:22)>
           ::_M_manager;
      local_f0._M_unused._M_object = &local_a8;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,(string *)(local_e0 + 0x18),
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_f0);
      if ((code *)local_e0._0_8_ != (code *)0x0) {
        (*(code *)local_e0._0_8_)(&local_f0,&local_f0,3);
      }
    }
LAB_00114ede:
    bVar5 = true;
    goto LAB_00114ee1;
  case 0x12:
    auVar8[0] = -(*local_70._M_dataplus._M_p == 'c');
    auVar8[1] = -(local_70._M_dataplus._M_p[1] == 'm');
    auVar8[2] = -((char)*(short *)(local_70._M_dataplus._M_p + 2) == 'a');
    auVar8[3] = -(local_70._M_dataplus._M_p[3] == 'k');
    auVar8[4] = -((char)*(int *)(local_70._M_dataplus._M_p + 4) == 'e');
    auVar8[5] = -(local_70._M_dataplus._M_p[5] == '_');
    auVar8[6] = -((char)*(short *)(local_70._M_dataplus._M_p + 6) == 'l');
    auVar8[7] = -(local_70._M_dataplus._M_p[7] == 'i');
    auVar8[8] = -((char)*(long *)(local_70._M_dataplus._M_p + 8) == 's');
    auVar8[9] = -(local_70._M_dataplus._M_p[9] == 't');
    auVar8[10] = -((char)*(short *)(local_70._M_dataplus._M_p + 10) == '_');
    auVar8[0xb] = -(local_70._M_dataplus._M_p[0xb] == 'p');
    auVar8[0xc] = -((char)*(int *)(local_70._M_dataplus._M_p + 0xc) == 'r');
    auVar8[0xd] = -(local_70._M_dataplus._M_p[0xd] == 'e');
    auVar8[0xe] = -((char)*(short *)(local_70._M_dataplus._M_p + 0xe) == 'p');
    auVar8[0xf] = -(local_70._M_dataplus._M_p[0xf] == 'e');
    auVar12[0] = -((char)(short)*(long *)(local_70._M_dataplus._M_p + 0x10) == 'n');
    auVar12[1] = -((char)((ushort)(short)*(long *)(local_70._M_dataplus._M_p + 0x10) >> 8) == 'd');
    auVar12[2] = 0xff;
    auVar12[3] = 0xff;
    auVar12[4] = 0xff;
    auVar12[5] = 0xff;
    auVar12[6] = 0xff;
    auVar12[7] = 0xff;
    auVar12[8] = 0xff;
    auVar12[9] = 0xff;
    auVar12[10] = 0xff;
    auVar12[0xb] = 0xff;
    auVar12[0xc] = 0xff;
    auVar12[0xd] = 0xff;
    auVar12[0xe] = 0xff;
    auVar12[0xf] = 0xff;
    auVar12 = auVar12 & auVar8;
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
      local_f0._8_8_ = 0;
      local_e0._8_8_ =
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1753:22)>
           ::_M_invoke;
      local_e0._0_8_ =
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1753:22)>
           ::_M_manager;
      local_f0._M_unused._M_object = &local_a8;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,(string *)(local_e0 + 0x18),
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_f0);
      if ((code *)local_e0._0_8_ != (code *)0x0) {
        (*(code *)local_e0._0_8_)(&local_f0,&local_f0,3);
      }
      goto LAB_00114ede;
    }
  }
  local_e0[0x17] = '\n';
  cmStrCat<char_const(&)[56],std::__cxx11::string_const&,char>
            ((string *)&local_f0,
             (char (*) [56])"Error: Unrecognized environment manipulation argument: ",&local_70,
             local_e0 + 0x17);
  Error((string *)&local_f0);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0._M_unused._0_8_
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0) {
    operator_delete(local_f0._M_unused._M_object,(ulong)(local_e0._0_8_ + 1));
  }
  bVar5 = false;
LAB_00114ee1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_00114f1d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._24_8_ != &local_b8) {
    operator_delete((void *)local_e0._24_8_,local_b8._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool cmSystemTools::EnvDiff::ParseOperation(const std::string& envmod)
{
  char path_sep = GetSystemPathlistSeparator();

  auto apply_diff = [this](const std::string& name,
                           std::function<void(std::string&)> const& apply) {
    cm::optional<std::string> old_value = diff[name];
    std::string output;
    if (old_value) {
      output = *old_value;
    } else {
      const char* curval = cmSystemTools::GetEnv(name);
      if (curval) {
        output = curval;
      }
    }
    apply(output);
    diff[name] = output;
  };

  // Split on `=`
  auto const eq_loc = envmod.find_first_of('=');
  if (eq_loc == std::string::npos) {
    cmSystemTools::Error(cmStrCat(
      "Error: Missing `=` after the variable name in: ", envmod, '\n'));
    return false;
  }

  auto const name = envmod.substr(0, eq_loc);

  // Split value on `:`
  auto const op_value_start = eq_loc + 1;
  auto const colon_loc = envmod.find_first_of(':', op_value_start);
  if (colon_loc == std::string::npos) {
    cmSystemTools::Error(
      cmStrCat("Error: Missing `:` after the operation in: ", envmod, '\n'));
    return false;
  }
  auto const op = envmod.substr(op_value_start, colon_loc - op_value_start);

  auto const value_start = colon_loc + 1;
  auto const value = envmod.substr(value_start);

  // Determine what to do with the operation.
  if (op == "reset"_s) {
    auto entry = diff.find(name);
    if (entry != diff.end()) {
      diff.erase(entry);
    }
  } else if (op == "set"_s) {
    diff[name] = value;
  } else if (op == "unset"_s) {
    diff[name] = cm::nullopt;
  } else if (op == "string_append"_s) {
    apply_diff(name, [&value](std::string& output) { output += value; });
  } else if (op == "string_prepend"_s) {
    apply_diff(name,
               [&value](std::string& output) { output.insert(0, value); });
  } else if (op == "path_list_append"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output += path_sep;
      }
      output += value;
    });
  } else if (op == "path_list_prepend"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), path_sep);
      }
      output.insert(0, value);
    });
  } else if (op == "cmake_list_append"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output += ';';
      }
      output += value;
    });
  } else if (op == "cmake_list_prepend"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), ';');
      }
      output.insert(0, value);
    });
  } else {
    cmSystemTools::Error(cmStrCat(
      "Error: Unrecognized environment manipulation argument: ", op, '\n'));
    return false;
  }

  return true;
}